

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall spoa::Graph::AddEdge(Graph *this,Node *tail,Node *head,uint32_t weight)

{
  bool bVar1;
  Edge *pEVar2;
  size_type sVar3;
  reference pvVar4;
  pointer local_70;
  pointer local_68 [3];
  Edge *local_50;
  reference local_48;
  Edge **it;
  iterator __end1;
  iterator __begin1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range1;
  uint32_t weight_local;
  Node *head_local;
  Node *tail_local;
  Graph *this_local;
  
  __end1 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                     (&tail->outedges);
  it = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                          (&tail->outedges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                *)&it);
    if (!bVar1) {
      pEVar2 = (Edge *)operator_new(0x30);
      sVar3 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                        (&this->sequences_);
      Edge::Edge(pEVar2,tail,head,(uint32_t)sVar3,weight);
      local_50 = pEVar2;
      std::
      vector<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>,std::allocator<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>>>
      ::emplace_back<spoa::Graph::Edge*>
                ((vector<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>,std::allocator<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>>>
                  *)&this->edges_,&local_50);
      pvVar4 = std::
               vector<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
               ::back(&this->edges_);
      local_68[0] = std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>::get
                              (pvVar4);
      std::vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>>::
      emplace_back<spoa::Graph::Edge*>
                ((vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>> *)&tail->outedges,
                 local_68);
      pvVar4 = std::
               vector<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
               ::back(&this->edges_);
      local_70 = std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>::get
                           (pvVar4);
      std::vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>>::
      emplace_back<spoa::Graph::Edge*>
                ((vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>> *)&head->inedges,
                 &local_70);
      return;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
               ::operator*(&__end1);
    if ((*local_48)->head == head) break;
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
    ::operator++(&__end1);
  }
  pEVar2 = *local_48;
  sVar3 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                    (&this->sequences_);
  Edge::AddSequence(pEVar2,(uint32_t)sVar3,weight);
  return;
}

Assistant:

void Graph::AddEdge(Node* tail, Node* head, std::uint32_t weight) {
  for (const auto& it : tail->outedges) {
    if (it->head == head) {
      it->AddSequence(sequences_.size(), weight);
      return;
    }
  }
  edges_.emplace_back(new Edge(tail, head, sequences_.size(), weight));
  tail->outedges.emplace_back(edges_.back().get());
  head->inedges.emplace_back(edges_.back().get());
}